

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::
SetupBackgroundSweep
          (HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *this,
          RecyclerSweep *recyclerSweep)

{
  code *pcVar1;
  bool bVar2;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> **ppSVar3;
  undefined8 *in_FS_OFFSET;
  RecyclerSweep *recyclerSweep_local;
  HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *this_local;
  
  bVar2 = AllocatorsAreEmpty(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x657,"(this->AllocatorsAreEmpty())","this->AllocatorsAreEmpty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  RecyclerSweep::
  SaveNextAllocableBlockHead<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
            (recyclerSweep,this);
  ppSVar3 = RecyclerSweep::
            GetPendingSweepBlockList<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
                      (recyclerSweep,this);
  if (*ppSVar3 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x65a,"(recyclerSweep.GetPendingSweepBlockList(this) == nullptr)",
                       "recyclerSweep.GetPendingSweepBlockList(this) == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  StopAllocationBeforeSweep(this);
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::SetupBackgroundSweep(RecyclerSweep& recyclerSweep)
{
    // Don't allocate from existing block temporary when concurrent sweeping

    // Currently Rescan clear allocators, if we remove the uncollectedAllocBytes there, we can
    // avoid it there and do it here.
    Assert(this->AllocatorsAreEmpty());

    DebugOnly(recyclerSweep.SaveNextAllocableBlockHead(this));
    Assert(recyclerSweep.GetPendingSweepBlockList(this) == nullptr);

    this->StopAllocationBeforeSweep();
}